

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseInitializer(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  char *two_char_token;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar3) {
    local_1 = 0;
  }
  else {
    uVar1 = (local_10->parse_state).mangled_idx;
    uVar2 = (local_10->parse_state).out_cur_idx;
    two_char_token = *(char **)&(local_10->parse_state).prev_name_idx;
    bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
    if (((bVar3) &&
        (bVar3 = ZeroOrMore((ParseFunc)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                            in_stack_ffffffffffffffa8), bVar3)) &&
       (bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)two_char_token >> 0x38)),
       bVar3)) {
      local_1 = 1;
    }
    else {
      (local_10->parse_state).mangled_idx = uVar1;
      (local_10->parse_state).out_cur_idx = uVar2;
      *(char **)&(local_10->parse_state).prev_name_idx = two_char_token;
      bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
      if (((bVar3) &&
          (bVar3 = ZeroOrMore((ParseFunc)
                              CONCAT17(in_stack_ffffffffffffffb7,
                                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)
                                      ),in_stack_ffffffffffffffa8), bVar3)) &&
         (bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)two_char_token >> 0x38))
         , bVar3)) {
        local_1 = 1;
      }
      else {
        (local_10->parse_state).mangled_idx = uVar1;
        (local_10->parse_state).out_cur_idx = uVar2;
        *(char **)&(local_10->parse_state).prev_name_idx = two_char_token;
        local_1 = 0;
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseInitializer(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  if (ParseTwoCharToken(state, "pi") && ZeroOrMore(ParseExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "il") &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;
  return false;
}